

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> * __thiscall
slang::ast::Compilation::getDefinitions
          (vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
           *__return_storage_ptr__,Compilation *this)

{
  const_iterator cVar1;
  Symbol *pSVar2;
  bool bVar3;
  pointer ppSVar4;
  ulong uVar5;
  ulong uVar6;
  const_iterator __position;
  string_view *__t;
  Symbol *sym;
  const_iterator __begin2;
  less local_71;
  vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *local_70;
  pointer local_68;
  pointer local_60;
  Symbol *local_58;
  iterator local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
             ::begin(&(this->definitionMap).table_);
  local_70 = __return_storage_ptr__;
  while (local_50.p_ != (table_element_pointer)0x0) {
    local_68 = ((local_50.p_)->second).first.
               super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    ppSVar4 = ((local_50.p_)->second).first.
              super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    while (ppSVar4 != local_68) {
      local_58 = *ppSVar4;
      __t = &local_58->name;
      cVar1._M_current =
           (__return_storage_ptr__->
           super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(__return_storage_ptr__->
                    super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)cVar1._M_current >> 3;
      local_60 = ppSVar4;
      while (__position._M_current = cVar1._M_current, __return_storage_ptr__ = local_70,
            0 < (long)uVar5) {
        uVar6 = uVar5 >> 1;
        pSVar2 = (__position._M_current + uVar6 + 1)[-1];
        local_40._M_len = (pSVar2->name)._M_len;
        local_40._M_str = (pSVar2->name)._M_str;
        bVar3 = std::ranges::less::
                operator()<const_std::basic_string_view<char,_std::char_traits<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                          (&local_71,__t,&local_40);
        uVar5 = ~uVar6 + uVar5;
        cVar1._M_current = __position._M_current + uVar6 + 1;
        if (bVar3) {
          cVar1._M_current = __position._M_current;
          uVar5 = uVar6;
        }
      }
      std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::insert
                (local_70,__position,&local_58);
      ppSVar4 = local_60 + 1;
    }
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Symbol*> Compilation::getDefinitions() const {
    std::vector<const Symbol*> result;
    for (auto& [key, val] : definitionMap) {
        for (auto sym : val.first) {
            result.insert(std::ranges::upper_bound(result, sym->name, {},
                                                   [](auto item) { return item->name; }),
                          sym);
        }
    }

    return result;
}